

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
 __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::
iterator<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Kernel::Literal*>
          (SubstitutionTree<Indexing::LiteralClause> *this,Literal *query,bool retrieveSubstitutions
          ,bool reversed)

{
  long *plVar1;
  char cVar2;
  undefined7 in_register_00000011;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *p;
  bool in_R8B;
  IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>_>
  IStack_48;
  Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_38;
  
  plVar1 = *(long **)&(query->super_Term)._functor;
  if ((plVar1 != (long *)0x0) && (cVar2 = (**(code **)(*plVar1 + 0x18))(), cVar2 == '\0')) {
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
    ::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>*,Indexing::SubstitutionTree<Indexing::LiteralClause>::Node*,Kernel::Literal*,bool,bool>
              ((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
                *)&local_38,(SubstitutionTree<Indexing::LiteralClause> *)query,
               *(Node **)&(query->super_Term)._functor,
               (Literal *)CONCAT71(in_register_00000011,retrieveSubstitutions),reversed,in_R8B);
    Lib::
    iterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
              (&IStack_48,(Lib *)&local_38,p);
    Lib::
    pvi<Lib::IterTraits<Lib::IterPointer<Lib::Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>>>
              ((Lib *)this,&IStack_48);
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&IStack_48);
    Lib::
    Recycled<Indexing::SubstitutionTree<Indexing::LiteralClause>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled(&local_38);
    return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
            )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
              *)this;
  }
  Lib::
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  ::getEmpty();
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
            *)this;
}

Assistant:

auto iterator(TermOrLit query, bool retrieveSubstitutions, bool reversed, Args... args)
  { return isEmpty() ? VirtualIterator<ELEMENT_TYPE(I)>::getEmpty()
                     : pvi(iterPointer(Recycled<I>(this, _root, query, retrieveSubstitutions, reversed, std::move(args)...)));
  }